

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  mapped_type_conflict mVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_RDX;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_RSI;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *in_RDI;
  TPZCompMesh *unaff_retaddr;
  void **in_stack_00000008;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *in_stack_00000010;
  stringstream sout;
  size_t in_stack_00000198;
  char *in_stack_000001a0;
  int64_t glIdx;
  int64_t lcIdx;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd78;
  key_type_conflict1 *in_stack_fffffffffffffdb8;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffdc0;
  string local_210 [32];
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  _Self local_68;
  _Self local_60;
  long local_58;
  mapped_type_conflict local_50;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *copy_00;
  
  local_30 = 0;
  local_38 = 0x21;
  copy_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024d5188);
  TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,copy_00,in_RSI,in_RDX);
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDivCollapsed_024d4d58;
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDivCollapsed_024d4d58;
  *(undefined8 *)
   &in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0xffffffffffffffff;
  in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.super_TPZCompEl.fMesh = (TPZCompMesh *)0xffffffffffffffff;
  *(undefined4 *)
   &in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl.fIndex = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
           super_TPZInterpolationSpace.super_TPZCompEl.fIndex + 4) = 1;
  (in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder =
       (int)(in_RDX->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_48 = 0;
  do {
    if (4 < local_48) {
      pzinternal::DebugStopImpl(in_stack_000001a0,in_stack_00000198);
      return;
    }
    local_50 = -1;
    plVar3 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)&in_RDX[3]._M_t._M_impl.super__Rb_tree_header,(long)local_48
                       );
    local_58 = *plVar3;
    if (local_58 == -1) {
      plVar3 = TPZVec<long>::operator[]
                         (&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_48);
      *plVar3 = -1;
    }
    else {
      local_60._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find(in_stack_fffffffffffffd78,(key_type_conflict1 *)0x1a646c0);
      local_68._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     (in_stack_fffffffffffffd78);
      bVar2 = std::operator!=(&local_60,&local_68);
      if (!bVar2) {
        std::__cxx11::stringstream::stringstream(local_1f0);
        poVar4 = std::operator<<(local_1e0,"ERROR in : ");
        poVar4 = std::operator<<(poVar4,
                                 "TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed(TPZCompMesh &, const TPZCompElHDivCollapsed<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeQuad]"
                                );
        poVar4 = std::operator<<(poVar4," trying to clone the connect index: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58);
        std::operator<<(poVar4," wich is not in mapped connect indexes!");
        std::__cxx11::stringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_210);
        plVar3 = TPZVec<long>::operator[]
                           (&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_48);
        *plVar3 = -1;
        std::__cxx11::stringstream::~stringstream(local_1f0);
        return;
      }
      in_stack_fffffffffffffdc0 =
           (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      mVar1 = *(mapped_type_conflict *)&(in_stack_fffffffffffffdc0->_M_t)._M_impl;
      local_50 = mVar1;
      plVar3 = TPZVec<long>::operator[]
                         (&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_48);
      *plVar3 = mVar1;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh,
												 const TPZCompElHDivCollapsed<TSHAPE> &copy,
												 std::map<int64_t,int64_t> & gl2lcConMap,
												 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap)
{
	
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<=TSHAPE::NFacets;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if(glIdx == -1)
		{
			// nothing to clone
			this->fConnectIndexes[i] = -1;
			continue;
		}
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end())
		{
			lcIdx = gl2lcConMap[glIdx];
		}
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
    // write the code when this constructor is called
    // Initialize top and bottom connects properly if needed be!
    DebugStop();
}